

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlCtxtDumpEntityDecl(xmlDebugCtxtPtr ctxt,xmlEntityPtr ent)

{
  xmlEntityPtr ent_local;
  xmlDebugCtxtPtr ctxt_local;
  
  xmlCtxtDumpSpaces(ctxt);
  if (ent == (xmlEntityPtr)0x0) {
    if (ctxt->check == 0) {
      fprintf((FILE *)ctxt->output,"Entity declaration is NULL\n");
    }
  }
  else if (ent->type == XML_ENTITY_DECL) {
    if (ent->name == (xmlChar *)0x0) {
      xmlDebugErr(ctxt,0x1397,"Entity declaration has no name");
    }
    else if (ctxt->check == 0) {
      fprintf((FILE *)ctxt->output,"ENTITYDECL(");
      xmlCtxtDumpString(ctxt,ent->name);
      fprintf((FILE *)ctxt->output,")");
    }
    if (ctxt->check == 0) {
      switch(ent->etype) {
      case XML_INTERNAL_GENERAL_ENTITY:
        fprintf((FILE *)ctxt->output,", internal\n");
        break;
      case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
        fprintf((FILE *)ctxt->output,", external parsed\n");
        break;
      case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
        fprintf((FILE *)ctxt->output,", unparsed\n");
        break;
      case XML_INTERNAL_PARAMETER_ENTITY:
        fprintf((FILE *)ctxt->output,", parameter\n");
        break;
      case XML_EXTERNAL_PARAMETER_ENTITY:
        fprintf((FILE *)ctxt->output,", external parameter\n");
        break;
      case XML_INTERNAL_PREDEFINED_ENTITY:
        fprintf((FILE *)ctxt->output,", predefined\n");
      }
      if (ent->ExternalID != (xmlChar *)0x0) {
        xmlCtxtDumpSpaces(ctxt);
        fprintf((FILE *)ctxt->output," ExternalID=%s\n",ent->ExternalID);
      }
      if (ent->SystemID != (xmlChar *)0x0) {
        xmlCtxtDumpSpaces(ctxt);
        fprintf((FILE *)ctxt->output," SystemID=%s\n",ent->SystemID);
      }
      if (ent->URI != (xmlChar *)0x0) {
        xmlCtxtDumpSpaces(ctxt);
        fprintf((FILE *)ctxt->output," URI=%s\n",ent->URI);
      }
      if (ent->content != (xmlChar *)0x0) {
        xmlCtxtDumpSpaces(ctxt);
        fprintf((FILE *)ctxt->output," content=");
        xmlCtxtDumpString(ctxt,ent->content);
        fprintf((FILE *)ctxt->output,"\n");
      }
    }
    xmlCtxtGenericNodeCheck(ctxt,(xmlNodePtr)ent);
  }
  else {
    xmlDebugErr(ctxt,0x13a2,"Node is not an entity declaration");
  }
  return;
}

Assistant:

static void
xmlCtxtDumpEntityDecl(xmlDebugCtxtPtr ctxt, xmlEntityPtr ent)
{
    xmlCtxtDumpSpaces(ctxt);

    if (ent == NULL) {
        if (!ctxt->check)
            fprintf(ctxt->output, "Entity declaration is NULL\n");
        return;
    }
    if (ent->type != XML_ENTITY_DECL) {
	xmlDebugErr(ctxt, XML_CHECK_NOT_ENTITY_DECL,
	            "Node is not an entity declaration");
        return;
    }
    if (ent->name != NULL) {
        if (!ctxt->check) {
            fprintf(ctxt->output, "ENTITYDECL(");
            xmlCtxtDumpString(ctxt, ent->name);
            fprintf(ctxt->output, ")");
        }
    } else
	xmlDebugErr(ctxt, XML_CHECK_NO_NAME,
	            "Entity declaration has no name");
    if (!ctxt->check) {
        switch (ent->etype) {
            case XML_INTERNAL_GENERAL_ENTITY:
                fprintf(ctxt->output, ", internal\n");
                break;
            case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
                fprintf(ctxt->output, ", external parsed\n");
                break;
            case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
                fprintf(ctxt->output, ", unparsed\n");
                break;
            case XML_INTERNAL_PARAMETER_ENTITY:
                fprintf(ctxt->output, ", parameter\n");
                break;
            case XML_EXTERNAL_PARAMETER_ENTITY:
                fprintf(ctxt->output, ", external parameter\n");
                break;
            case XML_INTERNAL_PREDEFINED_ENTITY:
                fprintf(ctxt->output, ", predefined\n");
                break;
        }
        if (ent->ExternalID) {
            xmlCtxtDumpSpaces(ctxt);
            fprintf(ctxt->output, " ExternalID=%s\n",
                    (char *) ent->ExternalID);
        }
        if (ent->SystemID) {
            xmlCtxtDumpSpaces(ctxt);
            fprintf(ctxt->output, " SystemID=%s\n",
                    (char *) ent->SystemID);
        }
        if (ent->URI != NULL) {
            xmlCtxtDumpSpaces(ctxt);
            fprintf(ctxt->output, " URI=%s\n", (char *) ent->URI);
        }
        if (ent->content) {
            xmlCtxtDumpSpaces(ctxt);
            fprintf(ctxt->output, " content=");
            xmlCtxtDumpString(ctxt, ent->content);
            fprintf(ctxt->output, "\n");
        }
    }

    /*
     * Do a bit of checking
     */
    xmlCtxtGenericNodeCheck(ctxt, (xmlNodePtr) ent);
}